

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimationNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  Node *pNVar1;
  XMLLoader *pXVar2;
  Ref<embree::SceneGraph::Node> RVar3;
  runtime_error *this_00;
  long *in_RDX;
  ulong uVar4;
  Ref<embree::SceneGraph::Node> local_90;
  Ref<embree::SceneGraph::Node> local_88;
  Ref<embree::SceneGraph::Node> local_80;
  XMLLoader *local_78;
  Ref<embree::SceneGraph::Node> nodei;
  string local_50;
  
  if (*(long *)(*in_RDX + 0x88) != *(long *)(*in_RDX + 0x80)) {
    loadNode(this,xml);
    pNVar1 = (Node *)(this->path).filename._M_dataplus._M_p;
    local_78 = this;
    for (uVar4 = 1; uVar4 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3);
        uVar4 = uVar4 + 1) {
      loadNode((XMLLoader *)&nodei,xml);
      local_80.ptr = pNVar1;
      if (pNVar1 != (Node *)0x0) {
        (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
      }
      RVar3.ptr = nodei.ptr;
      local_88.ptr = nodei.ptr;
      if (nodei.ptr != (Node *)0x0) {
        (*((nodei.ptr)->super_RefCount)._vptr_RefCount[2])(nodei.ptr);
      }
      SceneGraph::extend_animation(&local_80,&local_88);
      if (local_88.ptr != (Node *)0x0) {
        (*((local_88.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (local_80.ptr != (Node *)0x0) {
        (*((local_80.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      if (RVar3.ptr != (Node *)0x0) {
        (*((RVar3.ptr)->super_RefCount)._vptr_RefCount[3])(RVar3.ptr);
      }
    }
    local_90.ptr = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
    }
    SceneGraph::optimize_animation(&local_90);
    pXVar2 = local_78;
    if (local_90.ptr != (Node *)0x0) {
      (*((local_90.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    return (Ref<embree::SceneGraph::Node>)(Node *)pXVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nodei,
                 &local_50,": invalid Animation node");
  std::runtime_error::runtime_error(this_00,(string *)&nodei);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimationNode(const Ref<XML>& xml) 
  {
    if (xml->size() == 0) THROW_RUNTIME_ERROR(xml->loc.str()+": invalid Animation node");
    Ref<SceneGraph::Node> node = loadNode(xml->children[0]);
    for (size_t i=1; i<xml->size(); i++) {
      Ref<SceneGraph::Node> nodei = loadNode(xml->children[i]);
      SceneGraph::extend_animation(node,nodei);
    }
    SceneGraph::optimize_animation(node);
    return node;
  }